

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

EDataType Assimp::PLY::Property::ParseDataType(vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  Logger *this;
  EDataType local_14;
  EDataType eOut;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_14 = EDT_INVALID;
    bVar1 = DOM::TokenMatch(buffer,"char",4);
    if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"int8",4), bVar1)) {
      local_14 = EDT_Char;
    }
    else {
      bVar1 = DOM::TokenMatch(buffer,"uchar",5);
      if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"uint8",5), bVar1)) {
        local_14 = EDT_UChar;
      }
      else {
        bVar1 = DOM::TokenMatch(buffer,"short",5);
        if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"int16",5), bVar1)) {
          local_14 = EDT_Short;
        }
        else {
          bVar1 = DOM::TokenMatch(buffer,"ushort",6);
          if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"uint16",6), bVar1)) {
            local_14 = EDT_UShort;
          }
          else {
            bVar1 = DOM::TokenMatch(buffer,"int32",5);
            if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"int",3), bVar1)) {
              local_14 = EDT_Int;
            }
            else {
              bVar1 = DOM::TokenMatch(buffer,"uint32",6);
              if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"uint",4), bVar1)) {
                local_14 = EDT_UInt;
              }
              else {
                bVar1 = DOM::TokenMatch(buffer,"float",5);
                if ((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"float32",7), bVar1)) {
                  local_14 = EDT_Float;
                }
                else {
                  bVar1 = DOM::TokenMatch(buffer,"double64",8);
                  if (((bVar1) || (bVar1 = DOM::TokenMatch(buffer,"double",6), bVar1)) ||
                     (bVar1 = DOM::TokenMatch(buffer,"float64",7), bVar1)) {
                    local_14 = EDT_Double;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_14 == EDT_INVALID) {
      this = DefaultLogger::get();
      Logger::info(this,"Found unknown data type in PLY file. This is OK");
    }
    return local_14;
  }
  __assert_fail("!buffer.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x39,
                "static PLY::EDataType Assimp::PLY::Property::ParseDataType(std::vector<char> &)");
}

Assistant:

PLY::EDataType PLY::Property::ParseDataType(std::vector<char> &buffer) {
  ai_assert(!buffer.empty());

  PLY::EDataType eOut = PLY::EDT_INVALID;

  if (PLY::DOM::TokenMatch(buffer, "char", 4) ||
    PLY::DOM::TokenMatch(buffer, "int8", 4))
  {
    eOut = PLY::EDT_Char;
  }
  else if (PLY::DOM::TokenMatch(buffer, "uchar", 5) ||
    PLY::DOM::TokenMatch(buffer, "uint8", 5))
  {
    eOut = PLY::EDT_UChar;
  }
  else if (PLY::DOM::TokenMatch(buffer, "short", 5) ||
    PLY::DOM::TokenMatch(buffer, "int16", 5))
  {
    eOut = PLY::EDT_Short;
  }
  else if (PLY::DOM::TokenMatch(buffer, "ushort", 6) ||
    PLY::DOM::TokenMatch(buffer, "uint16", 6))
  {
    eOut = PLY::EDT_UShort;
  }
  else if (PLY::DOM::TokenMatch(buffer, "int32", 5) || PLY::DOM::TokenMatch(buffer, "int", 3))
  {
    eOut = PLY::EDT_Int;
  }
  else if (PLY::DOM::TokenMatch(buffer, "uint32", 6) || PLY::DOM::TokenMatch(buffer, "uint", 4))
  {
    eOut = PLY::EDT_UInt;
  }
  else if (PLY::DOM::TokenMatch(buffer, "float", 5) || PLY::DOM::TokenMatch(buffer, "float32", 7))
  {
    eOut = PLY::EDT_Float;
  }
  else if (PLY::DOM::TokenMatch(buffer, "double64", 8) || PLY::DOM::TokenMatch(buffer, "double", 6) ||
    PLY::DOM::TokenMatch(buffer, "float64", 7))
  {
    eOut = PLY::EDT_Double;
  }
  if (PLY::EDT_INVALID == eOut)
  {
      ASSIMP_LOG_INFO("Found unknown data type in PLY file. This is OK");
  }

  return eOut;
}